

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.c
# Opt level: O0

char * format_print_info(void)

{
  return 
  "Format Library 0.8.8\nCopyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\nCompiled as shared library type\n\n"
  ;
}

Assistant:

const char *format_print_info(void)
{
	static const char format_info[] =
		"Format Library " METACALL_VERSION "\n"
		"Copyright (C) 2016 - 2025 Vicente Eduardo Ferrer Garcia <vic798@gmail.com>\n"

#ifdef FORMAT_STATIC_DEFINE
		"Compiled as static library type\n"
#else
		"Compiled as shared library type\n"
#endif

		"\n";

	return format_info;
}